

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trompeloeil.hpp
# Opt level: O1

void __thiscall trompeloeil::sequence_matcher::retire_predecessors(sequence_matcher *this)

{
  sequence_matcher *psVar1;
  long lVar2;
  long lVar3;
  sequence_matcher *this_00;
  
  psVar1 = *(sequence_matcher **)(this + 0x40);
  this_00 = *(sequence_matcher **)(psVar1 + 8);
  if (this_00 != this && this_00 != psVar1) {
    do {
      list_elem<trompeloeil::sequence_matcher>::invariant_check
                ((list_elem<trompeloeil::sequence_matcher> *)this_00);
      lVar2 = *(long *)((list_elem<trompeloeil::sequence_matcher> *)this_00 + 8);
      lVar3 = *(long *)((list_elem<trompeloeil::sequence_matcher> *)this_00 + 0x10);
      *(long *)(lVar2 + 0x10) = lVar3;
      *(long *)(lVar3 + 8) = lVar2;
      *(sequence_matcher **)((list_elem<trompeloeil::sequence_matcher> *)this_00 + 8) = this_00;
      *(sequence_matcher **)((list_elem<trompeloeil::sequence_matcher> *)this_00 + 0x10) = this_00;
      list_elem<trompeloeil::sequence_matcher>::invariant_check
                ((list_elem<trompeloeil::sequence_matcher> *)this_00);
      this_00 = *(sequence_matcher **)(psVar1 + 8);
      if (this_00 == psVar1) {
        return;
      }
    } while (this_00 != this);
  }
  return;
}

Assistant:

void
    retire_predecessors()
    noexcept
    {
      seq.retire_until(this);
    }